

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_revsurface.cpp
# Opt level: O1

void __thiscall ON_RevSurface::Destroy(ON_RevSurface *this)

{
  double dVar1;
  ON_3dPoint from_pt;
  ON_3dPoint to_pt;
  double dVar2;
  double dVar3;
  ON_3dPoint local_30;
  
  ON_Surface::DestroySurfaceTree(&this->super_ON_Surface);
  if (this->m_curve != (ON_Curve *)0x0) {
    (*(this->m_curve->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])();
    this->m_curve = (ON_Curve *)0x0;
  }
  dVar3 = ON_3dPoint::Origin.z;
  dVar2 = ON_3dPoint::Origin.y;
  dVar1 = ON_3dPoint::Origin.x;
  ON_3dPoint::ON_3dPoint(&local_30,&ON_3dVector::ZAxis);
  from_pt.y = dVar2;
  from_pt.x = dVar1;
  from_pt.z = dVar3;
  to_pt.y = local_30.y;
  to_pt.x = local_30.x;
  to_pt.z = local_30.z;
  ON_Line::Create(&this->m_axis,from_pt,to_pt);
  ON_Interval::Set(&this->m_angle,0.0,6.283185307179586);
  dVar1 = (this->m_angle).m_t[1];
  (this->m_t).m_t[0] = (this->m_angle).m_t[0];
  (this->m_t).m_t[1] = dVar1;
  this->m_bTransposed = false;
  ON_BoundingBox::Destroy(&this->m_bbox);
  return;
}

Assistant:

void ON_RevSurface::Destroy()
{
  DestroySurfaceTree();
  if ( m_curve)
  {
    delete m_curve;
    m_curve = 0;
  }
  m_axis.Create( ON_3dPoint::Origin, ON_3dVector::ZAxis );
  m_angle.Set(0.0,2.0*ON_PI);
  m_t = m_angle;
  m_bTransposed = false;
  m_bbox.Destroy();
}